

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::GridRenderTestCase
          (GridRenderTestCase *this,TestContext *testCtx,string *name,string *description,
          Flags flags)

{
  int *value;
  ostringstream *poVar1;
  ostringstream *poVar2;
  ulong uVar3;
  MessageBuilder *pMVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  MessageBuilder msg;
  
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c09578;
  uVar9 = CONCAT44(-(uint)((flags & 4) == 0),-(uint)((flags & 1) == 0));
  uVar3 = (ulong)DAT_009e7600;
  uVar10 = (ulong)DAT_009e7610;
  this->m_flags = flags;
  uVar10 = uVar9 & uVar10 | ~uVar9 & uVar3;
  this->m_tessGenLevel = (int)uVar10;
  this->m_numGeometryInvocations = (int)(uVar10 >> 0x20);
  iVar5 = 8;
  if ((flags & 0x40) == 0) {
    iVar5 = 1;
  }
  this->m_numLayers = iVar5;
  msg.m_log = testCtx->m_log;
  poVar1 = &msg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Testing tessellation and geometry shaders that output a large number of primitives.\n"
                 );
  std::operator<<((ostream *)poVar1,
                  (this->super_TestCase).super_TestCase.super_TestNode.m_description._M_dataplus.
                  _M_p);
  tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if ((this->m_flags & 0x40) != 0) {
    msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &msg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Rendering to 2d texture array, numLayers = ");
    pMVar4 = tcu::MessageBuilder::operator<<(&msg,&this->m_numLayers);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &msg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,"Tessellation level: ");
  value = &this->m_tessGenLevel;
  pMVar4 = tcu::MessageBuilder::operator<<(&msg,value);
  poVar1 = &pMVar4->m_str;
  std::operator<<((ostream *)poVar1,", mode = quad.\n");
  std::operator<<((ostream *)poVar1,"\tEach input patch produces ");
  std::ostream::operator<<(poVar1,*value * *value);
  std::operator<<((ostream *)poVar1," (");
  std::ostream::operator<<(poVar1,*value * *value * 2);
  std::operator<<((ostream *)poVar1," triangles)\n");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  uVar6 = this->m_flags;
  if ((uVar6 & 2) == 0) {
    uVar8 = 0x10;
  }
  else {
    msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &msg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Using geometry shader minimum maximum output limits.");
    tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    uVar6 = this->m_flags;
    uVar8 = 0x100;
  }
  if ((uVar6 & 6) != 0) {
    msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &msg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Geometry shader, targeting following limits:\n");
    uVar6 = this->m_flags;
    if ((uVar6 & 2) != 0) {
      std::operator<<((ostream *)poVar1,"\tmaxGeometryOutputComponents = ");
      std::ostream::operator<<(poVar1,0x40);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"\tmaxGeometryOutputVertices = ");
      std::ostream::operator<<(poVar1,uVar8);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"\tmaxGeometryTotalOutputComponents = ");
      std::ostream::operator<<(poVar1,0x400);
      std::operator<<((ostream *)poVar1,"\n");
      uVar6 = this->m_flags;
    }
    if ((uVar6 & 4) != 0) {
      std::operator<<((ostream *)poVar1,"\tmaxGeometryShaderInvocations = ");
      tcu::MessageBuilder::operator<<(&msg,&this->m_numGeometryInvocations);
    }
    tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    uVar6 = this->m_flags;
  }
  if ((uVar6 & 0x20) == 0) {
    uVar8 = uVar8 >> 1;
    if (0x3f < uVar8) {
      uVar8 = 0x40;
    }
    iVar5 = uVar8 * 2;
    uVar6 = uVar8 * 2 - 2;
  }
  else {
    uVar6 = 0x20;
    if (uVar8 >> 2 < 0x20) {
      uVar6 = uVar8 >> 2;
    }
    iVar5 = uVar6 * 4;
  }
  this->m_numGeometryPrimitivesPerInvocation = uVar6;
  iVar7 = this->m_numGeometryInvocations;
  msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = &msg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  std::operator<<((ostream *)poVar2,"Geometry shader:\n");
  std::operator<<((ostream *)poVar2,"\tTotal output vertex count per invocation: ");
  std::ostream::operator<<(poVar2,iVar5);
  std::operator<<((ostream *)poVar2,"\n");
  std::operator<<((ostream *)poVar2,"\tTotal output primitive count per invocation: ");
  pMVar4 = tcu::MessageBuilder::operator<<(&msg,&this->m_numGeometryPrimitivesPerInvocation);
  std::operator<<((ostream *)&pMVar4->m_str,"\n");
  std::operator<<((ostream *)&pMVar4->m_str,"\tNumber of invocations per primitive: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_numGeometryInvocations);
  poVar1 = &pMVar4->m_str;
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tTotal output vertex count per input primitive: ");
  iVar5 = iVar5 * iVar7;
  std::ostream::operator<<(poVar1,iVar5);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tTotal output primitive count per input primitive: ");
  iVar7 = uVar6 * iVar7;
  std::ostream::operator<<(poVar1,iVar7);
  std::operator<<((ostream *)poVar1,"\n");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
  msg.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &msg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Program:\n");
  std::operator<<((ostream *)poVar1,"\tTotal program output vertices count per input patch: ");
  std::ostream::operator<<(poVar1,iVar5 * *value * *value * 2);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"\tTotal program output primitive count per input patch: ");
  std::ostream::operator<<(poVar1,iVar7 * *value * *value * 2);
  std::operator<<((ostream *)poVar1,"\n");
  tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  return;
}

Assistant:

GridRenderTestCase::GridRenderTestCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, const Flags flags)
	: TestCase					(testCtx, name, description)
	, m_flags					(flags)
	, m_tessGenLevel			((m_flags & FLAG_TESSELLATION_MAX_SPEC)			? 64 : 5)
	, m_numGeometryInvocations	((m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC)	? 32 : 4)
	, m_numLayers				((m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)		? 8  : 1)
{
	DE_ASSERT(((flags & (FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SCATTER_LAYERS)) != 0) == ((flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) != 0));

	testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing tessellation and geometry shaders that output a large number of primitives.\n"
		<< getDescription()
		<< tcu::TestLog::EndMessage;

	if (m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to 2d texture array, numLayers = " << m_numLayers << tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Tessellation level: " << m_tessGenLevel << ", mode = quad.\n"
		<< "\tEach input patch produces " << (m_tessGenLevel*m_tessGenLevel) << " (" << (m_tessGenLevel*m_tessGenLevel*2) << " triangles)\n"
		<< tcu::TestLog::EndMessage;

	int geometryOutputComponents	  = 0;
	int geometryOutputVertices		  = 0;
	int geometryTotalOutputComponents = 0;

	if (m_flags & FLAG_GEOMETRY_MAX_SPEC)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Using geometry shader minimum maximum output limits." << tcu::TestLog::EndMessage;

		geometryOutputComponents	  = 64;
		geometryOutputVertices		  = 256;
		geometryTotalOutputComponents = 1024;
	}
	else
	{
		geometryOutputComponents	  = 64;
		geometryOutputVertices		  = 16;
		geometryTotalOutputComponents = 1024;
	}

	if ((m_flags & FLAG_GEOMETRY_MAX_SPEC) || (m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC))
	{
		tcu::MessageBuilder msg(&m_testCtx.getLog());

		msg << "Geometry shader, targeting following limits:\n";

		if (m_flags & FLAG_GEOMETRY_MAX_SPEC)
			msg	<< "\tmaxGeometryOutputComponents = "	   << geometryOutputComponents << "\n"
				<< "\tmaxGeometryOutputVertices = "		   << geometryOutputVertices << "\n"
				<< "\tmaxGeometryTotalOutputComponents = " << geometryTotalOutputComponents << "\n";

		if (m_flags & FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC)
			msg << "\tmaxGeometryShaderInvocations = "	   << m_numGeometryInvocations;

		msg << tcu::TestLog::EndMessage;
	}

	const bool	separatePrimitives				  = (m_flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) != 0;
	const int	numComponentsPerVertex			  = 8; // vec4 pos, vec4 color
	int			numVerticesPerInvocation		  = 0;
	int			geometryVerticesPerPrimitive	  = 0;
	int			geometryPrimitivesOutPerPrimitive = 0;

	if (separatePrimitives)
	{
		const int	numComponentLimit		 = geometryTotalOutputComponents / (4 * numComponentsPerVertex);
		const int	numOutputLimit			 = geometryOutputVertices / 4;

		m_numGeometryPrimitivesPerInvocation = de::min(numComponentLimit, numOutputLimit);
		numVerticesPerInvocation			 = m_numGeometryPrimitivesPerInvocation * 4;
	}
	else
	{
		// If FLAG_GEOMETRY_SEPARATE_PRIMITIVES is not set, geometry shader fills a rectangle area in slices.
		// Each slice is a triangle strip and is generated by a single shader invocation.
		// One slice with 4 segment ends (nodes) and 3 segments:
		//    .__.__.__.
		//    |\ |\ |\ |
		//    |_\|_\|_\|

		const int	numSliceNodesComponentLimit	= geometryTotalOutputComponents / (2 * numComponentsPerVertex);			// each node 2 vertices
		const int	numSliceNodesOutputLimit	= geometryOutputVertices / 2;											// each node 2 vertices
		const int	numSliceNodes				= de::min(numSliceNodesComponentLimit, numSliceNodesOutputLimit);

		numVerticesPerInvocation				= numSliceNodes * 2;
		m_numGeometryPrimitivesPerInvocation	= (numSliceNodes - 1) * 2;
	}

	geometryVerticesPerPrimitive	  = numVerticesPerInvocation * m_numGeometryInvocations;
	geometryPrimitivesOutPerPrimitive = m_numGeometryPrimitivesPerInvocation * m_numGeometryInvocations;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Geometry shader:\n"
		<< "\tTotal output vertex count per invocation: "		  << numVerticesPerInvocation << "\n"
		<< "\tTotal output primitive count per invocation: "	  << m_numGeometryPrimitivesPerInvocation << "\n"
		<< "\tNumber of invocations per primitive: "			  << m_numGeometryInvocations << "\n"
		<< "\tTotal output vertex count per input primitive: "	  << geometryVerticesPerPrimitive << "\n"
		<< "\tTotal output primitive count per input primitive: " << geometryPrimitivesOutPerPrimitive << "\n"
		<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Program:\n"
		<< "\tTotal program output vertices count per input patch: "  << (m_tessGenLevel*m_tessGenLevel*2 * geometryVerticesPerPrimitive) << "\n"
		<< "\tTotal program output primitive count per input patch: " << (m_tessGenLevel*m_tessGenLevel*2 * geometryPrimitivesOutPerPrimitive) << "\n"
		<< tcu::TestLog::EndMessage;
}